

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.cpp
# Opt level: O3

int __thiscall ThreadPool::busyThreads(ThreadPool *this)

{
  int iVar1;
  
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->mMutex);
  if (iVar1 == 0) {
    iVar1 = this->mBusyThreads;
    pthread_mutex_unlock((pthread_mutex_t *)&this->mMutex);
    return iVar1;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

int ThreadPool::busyThreads() const
{
    std::lock_guard<std::mutex> lock(mMutex);
    return mBusyThreads;
}